

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

natwm_error map_search(map *map,void *key,uint32_t *index)

{
  map_entry *pmVar1;
  _Bool _Var2;
  natwm_error nVar3;
  uint32_t uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  nVar3 = GENERIC_ERROR;
  if (index != (uint32_t *)0x0 && key != (void *)0x0) {
    sVar5 = (*map->key_size_function)(key);
    uVar4 = (*map->hash_function)(key,sVar5);
    uVar6 = (ulong)map->length;
    uVar8 = (ulong)uVar4 % uVar6;
    uVar7 = 0xffffffffffffffff;
    do {
      if ((uint)uVar6 <= (uint)uVar8) {
        uVar8 = 0;
      }
      pmVar1 = map->entries[uVar8];
      if (((pmVar1 != (map_entry *)0x0) && (pmVar1->key != (void *)0x0)) &&
         ((int *)pmVar1->value != &EMPTY_ENTRY)) {
        _Var2 = (*map->key_compare_function)(key,pmVar1->key,sVar5);
        if (_Var2) {
          *index = (uint32_t)uVar8;
          return NO_ERROR;
        }
        uVar6 = (ulong)map->length;
      }
      uVar8 = (ulong)((uint32_t)uVar8 + 1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar6);
    nVar3 = NOT_FOUND_ERROR;
  }
  return nVar3;
}

Assistant:

static enum natwm_error map_search(const struct map *map, const void *key, uint32_t *index)
{
        if (key == NULL || index == NULL) {
                return GENERIC_ERROR;
        }

        // Initialize index with initial bucket index
        size_t key_size = map->key_size_function(key);
        uint32_t current_index = map->hash_function(key, key_size) % map->length;

        for (size_t i = 0; i <= map->length; ++i) {
                if ((current_index) >= map->length) {
                        current_index = 0;
                }

                struct map_entry *entry = map->entries[current_index];

                if (!is_entry_present(entry)
                    || !map->key_compare_function(key, entry->key, key_size)) {
                        current_index += 1;

                        continue;
                }

                *index = current_index;

                return NO_ERROR;
        }

        return NOT_FOUND_ERROR;
}